

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  secp256k1_fe x;
  secp256k1_fe y;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  iVar3 = 0;
  iVar2 = iVar3;
  if (size == 0x41) {
    if ((*pub < 8) && ((0xd0U >> (*pub & 0x1f) & 1) != 0)) {
      secp256k1_fe_impl_set_b32_mod(&local_80,pub + 1);
      iVar2 = 0;
      if (((local_80.n[0] < 0xffffefffffc2f) ||
          ((local_80.n[4] != 0xffffffffffff ||
           ((local_80.n[2] & local_80.n[3] & local_80.n[1]) != 0xfffffffffffff)))) &&
         ((secp256k1_fe_impl_set_b32_mod(&local_58,pub + 0x21), local_58.n[0] < 0xffffefffffc2f ||
          ((local_58.n[4] != 0xffffffffffff ||
           ((local_58.n[2] & local_58.n[3] & local_58.n[1]) != 0xfffffffffffff)))))) {
        elem->infinity = 0;
        (elem->x).n[4] = local_80.n[4];
        (elem->x).n[2] = local_80.n[2];
        (elem->x).n[3] = local_80.n[3];
        (elem->x).n[0] = local_80.n[0];
        (elem->x).n[1] = local_80.n[1];
        (elem->y).n[4] = local_58.n[4];
        (elem->y).n[2] = local_58.n[2];
        (elem->y).n[3] = local_58.n[3];
        (elem->y).n[0] = local_58.n[0];
        (elem->y).n[1] = local_58.n[1];
        if (((*pub & 0xfe) == 6 & (*pub != 7 ^ (byte)local_58.n[0] ^ 1)) == 0) {
          iVar2 = secp256k1_ge_is_valid_var(elem);
        }
      }
    }
  }
  else {
    iVar2 = 0;
    if (((size == 0x21) && (bVar1 = *pub, iVar2 = iVar3, (bVar1 & 0xfe) == 2)) &&
       ((secp256k1_fe_impl_set_b32_mod(&local_80,pub + 1), local_80.n[0] < 0xffffefffffc2f ||
        ((local_80.n[4] != 0xffffffffffff ||
         (iVar2 = 0, (local_80.n[2] & local_80.n[3] & local_80.n[1]) != 0xfffffffffffff)))))) {
      iVar2 = secp256k1_ge_set_xo_var(elem,&local_80,(uint)(bVar1 == 3));
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}